

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_RaiseSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *this;
  VMValue *pVVar2;
  AActor *thing;
  AActor *u;
  bool bVar3;
  AActor *local_80;
  bool local_63;
  AActor *mo;
  TThinkerIterator<AActor> it;
  bool copy;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x121e,
                  "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    this = (AActor *)(param->field_0).field_1.a;
    local_63 = true;
    if (this != (AActor *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 != false) {
      if (numparam < 2) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x121f,
                        "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        iVar1 = (pVVar2->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x121f,
                        "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[1].field_0.i;
      }
      it.super_FThinkerIterator._23_1_ = iVar1 != 0;
      TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
      bVar3 = TObjPtr<AActor>::operator!=(&this->master,(AActor *)0x0);
      if (bVar3) {
        while (thing = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo,false),
              thing != (AActor *)0x0) {
          u = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->master);
          bVar3 = TObjPtr<AActor>::operator==(&thing->master,u);
          if ((bVar3) && (thing != this)) {
            local_80 = this;
            if ((it.super_FThinkerIterator._23_1_ & 1) == 0) {
              local_80 = (AActor *)0x0;
            }
            P_Thing_Raise(thing,local_80);
          }
        }
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x121e,
                  "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x121e,
                "int AF_AActor_A_RaiseSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ((mo = it.Next()) != NULL)
		{
			if (mo->master == self->master && mo != self)
			{
				P_Thing_Raise(mo, copy ? self : NULL);
			}
		}
	}
	return 0;
}